

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_predictor_8x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i row;
  uint32_t sum;
  __m128i sum_above;
  __m128i sum_left;
  longlong local_d8;
  longlong lStack_d0;
  int local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint8_t *local_90;
  ptrdiff_t local_88;
  uint8_t *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_29;
  longlong local_28;
  longlong lStack_20;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_90 = in_RDX;
  local_88 = in_RSI;
  local_80 = in_RDI;
  dc_sum_4(in_RCX);
  local_a8 = extraout_XMM0_Qa;
  uStack_a0 = extraout_XMM0_Qb;
  dc_sum_8(local_90);
  local_78 = local_a8;
  uVar1 = local_78;
  uStack_70 = uStack_a0;
  uVar2 = uStack_70;
  local_68 = (short)extraout_XMM0_Qa_00;
  sStack_66 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  sStack_64 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  sStack_62 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  sStack_60 = (short)extraout_XMM0_Qb_00;
  sStack_5e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  sStack_5c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  sStack_5a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  local_78._0_2_ = (short)local_a8;
  local_78._2_2_ = (short)((ulong)local_a8 >> 0x10);
  local_78._4_2_ = (short)((ulong)local_a8 >> 0x20);
  local_78._6_2_ = (short)((ulong)local_a8 >> 0x30);
  uStack_70._0_2_ = (short)uStack_a0;
  uStack_70._2_2_ = (short)((ulong)uStack_a0 >> 0x10);
  uStack_70._4_2_ = (short)((ulong)uStack_a0 >> 0x20);
  uStack_70._6_2_ = (short)((ulong)uStack_a0 >> 0x30);
  local_b8._0_4_ = CONCAT22(sStack_66 + local_78._2_2_,local_68 + (short)local_78);
  local_b8 = CONCAT26(sStack_62 + local_78._6_2_,CONCAT24(sStack_64 + local_78._4_2_,(int)local_b8))
  ;
  uStack_b0 = CONCAT26(sStack_5a + uStack_70._6_2_,
                       CONCAT24(sStack_5c + uStack_70._4_2_,
                                CONCAT22(sStack_5e + uStack_70._2_2_,sStack_60 + (short)uStack_70)))
  ;
  local_48 = local_b8;
  uStack_40 = uStack_b0;
  local_58 = local_b8;
  uStack_50 = uStack_b0;
  local_bc = (int)local_b8 + 6;
  local_78 = uVar1;
  uStack_70 = uVar2;
  local_bc = divide_using_multiply_shift(local_bc,2,0x5556);
  local_29 = (undefined1)local_bc;
  local_1 = (undefined1)local_bc;
  local_2 = (undefined1)local_bc;
  local_3 = (undefined1)local_bc;
  local_4 = (undefined1)local_bc;
  local_5 = (undefined1)local_bc;
  local_6 = (undefined1)local_bc;
  local_7 = (undefined1)local_bc;
  local_8 = (undefined1)local_bc;
  local_9 = (undefined1)local_bc;
  local_a = (undefined1)local_bc;
  local_b = (undefined1)local_bc;
  local_c = (undefined1)local_bc;
  local_d = (undefined1)local_bc;
  local_e = (undefined1)local_bc;
  local_f = (undefined1)local_bc;
  local_10 = (undefined1)local_bc;
  local_d8 = CONCAT17((undefined1)local_bc,
                      CONCAT16((undefined1)local_bc,
                               CONCAT15((undefined1)local_bc,
                                        CONCAT14((undefined1)local_bc,
                                                 CONCAT13((undefined1)local_bc,
                                                          CONCAT12((undefined1)local_bc,
                                                                   CONCAT11((undefined1)local_bc,
                                                                            (undefined1)local_bc))))
                                       )));
  lStack_d0 = CONCAT17((undefined1)local_bc,
                       CONCAT16((undefined1)local_bc,
                                CONCAT15((undefined1)local_bc,
                                         CONCAT14((undefined1)local_bc,
                                                  CONCAT13((undefined1)local_bc,
                                                           CONCAT12((undefined1)local_bc,
                                                                    CONCAT11((undefined1)local_bc,
                                                                             (undefined1)local_bc)))
                                                 ))));
  local_28 = local_d8;
  lStack_20 = lStack_d0;
  dc_store_8xh((__m128i *)&local_d8,4,local_80,local_88);
  return;
}

Assistant:

void aom_dc_predictor_8x4_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_4(left);
  __m128i sum_above = dc_sum_8(above);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 6;
  sum = divide_using_multiply_shift(sum, 2, DC_MULTIPLIER_1X2);

  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_8xh(&row, 4, dst, stride);
}